

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O2

void __thiscall spdlog::details::registry::flush_every(registry *this,seconds interval)

{
  code *__p;
  function<void_()> clbk;
  code *local_50 [2];
  registry *local_40;
  _Function_base local_38;
  
  std::mutex::lock(&this->flusher_mutex_);
  local_50[0] = flush_all;
  local_50[1] = (code *)0x0;
  local_40 = this;
  std::function<void()>::
  function<std::_Bind<void(spdlog::details::registry::*(spdlog::details::registry*))()>,void>
            ((function<void()> *)&local_38,
             (_Bind<void_(spdlog::details::registry::*(spdlog::details::registry_*))()> *)local_50);
  std::
  make_unique<spdlog::details::periodic_worker,std::function<void()>&,std::chrono::duration<long,std::ratio<1l,1l>>&>
            ((function<void_()> *)local_50,(duration<long,_std::ratio<1L,_1L>_> *)&local_38);
  __p = local_50[0];
  local_50[0] = (code *)0x0;
  std::
  __uniq_ptr_impl<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
  ::reset((__uniq_ptr_impl<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
           *)&this->periodic_flusher_,(pointer)__p);
  std::
  unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
  ::~unique_ptr((unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
                 *)local_50);
  std::_Function_base::~_Function_base(&local_38);
  pthread_mutex_unlock((pthread_mutex_t *)&this->flusher_mutex_);
  return;
}

Assistant:

SPDLOG_INLINE void registry::flush_every(std::chrono::seconds interval)
{
    std::lock_guard<std::mutex> lock(flusher_mutex_);
    std::function<void()> clbk = std::bind(&registry::flush_all, this);
    periodic_flusher_ = details::make_unique<periodic_worker>(clbk, interval);
}